

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void std::__insertion_sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (iterator __first,QString *__last)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  Data *pDVar3;
  QArrayData *pQVar4;
  int iVar5;
  longlong __old_val;
  iterator __last_00;
  QStringView QVar6;
  QStringView QVar7;
  
  if (__first.i != __last) {
    for (__last_00.i = __first.i + 1; __last_00.i != __last; __last_00.i = __last_00.i + 1) {
      pcVar1 = ((__last_00.i)->d).ptr;
      qVar2 = ((__last_00.i)->d).size;
      QVar6.m_data = pcVar1;
      QVar6.m_size = qVar2;
      QVar7.m_data = ((__first.i)->d).ptr;
      QVar7.m_size = ((__first.i)->d).size;
      iVar5 = QtPrivate::compareStrings(QVar6,QVar7,CaseSensitive);
      if (iVar5 < 0) {
        pDVar3 = ((__last_00.i)->d).d;
        ((__last_00.i)->d).d = (Data *)0x0;
        ((__last_00.i)->d).ptr = (char16_t *)0x0;
        ((__last_00.i)->d).size = 0;
        __copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<QList<QString>::iterator,QList<QString>::iterator>
                  (__first,__last_00,__last_00.i + 1);
        pQVar4 = &(((__first.i)->d).d)->super_QArrayData;
        ((__first.i)->d).d = pDVar3;
        ((__first.i)->d).ptr = pcVar1;
        ((__first.i)->d).size = qVar2;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
      }
      else {
        __unguarded_linear_insert<QList<QString>::iterator,__gnu_cxx::__ops::_Val_less_iter>
                  (__last_00.i);
      }
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }